

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O3

bool ImGui::BeginMenuEx(char *label,char *icon,bool enabled)

{
  ImGuiItemStatusFlags *pIVar1;
  float fVar2;
  ImVec2 IVar3;
  int iVar4;
  ImGuiWindow *this;
  ImDrawList *draw_list;
  ImGuiPopupData *pIVar5;
  ImGuiWindow *pIVar6;
  undefined8 uVar7;
  ImVec2 IVar8;
  ImGuiContext *pIVar9;
  bool bVar10;
  bool bVar11;
  byte bVar12;
  ImGuiID id;
  ImU32 col;
  long lVar13;
  uint *__dest;
  byte bVar14;
  int iVar15;
  byte bVar16;
  uint *puVar17;
  int iVar18;
  byte bVar19;
  byte bVar20;
  uint uVar21;
  float fVar22;
  float fVar23;
  ImVec2 IVar24;
  ImVec2 pos;
  undefined8 extraout_XMM0_Qb;
  float fVar25;
  float fVar26;
  float fVar27;
  ImVec2 ta;
  bool local_101;
  ImVec2 local_d8;
  uint local_d0;
  uint local_cc;
  ImVec2 local_c8;
  ImVec2 local_b0;
  ImVec2 local_a8;
  undefined8 uStack_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 uStack_88;
  undefined4 uStack_80;
  float local_7c;
  float fStack_78;
  ImVec2 IStack_74;
  ImVec2 local_68;
  undefined8 uStack_60;
  undefined1 local_58 [16];
  undefined1 local_48 [16];
  ImVec2 local_38;
  
  pIVar9 = GImGui;
  GImGui->CurrentWindow->WriteAccessed = true;
  this = pIVar9->CurrentWindow;
  if (this->SkipItems == false) {
    id = ImGuiWindow::GetID(this,label,(char *)0x0);
    local_101 = IsPopupOpen(id,0);
    local_cc = (uint)((*(byte *)((long)&this->Flags + 3) & 0x10) >> 4) << 0x18 | 0x10080145;
    __dest = (pIVar9->MenusIdSubmittedThisFrame).Data;
    iVar4 = (pIVar9->MenusIdSubmittedThisFrame).Size;
    lVar13 = (long)iVar4;
    puVar17 = __dest;
    do {
      if (__dest + lVar13 <= puVar17) {
        if (iVar4 == (pIVar9->MenusIdSubmittedThisFrame).Capacity) {
          if (iVar4 == 0) {
            iVar15 = 8;
          }
          else {
            iVar15 = iVar4 / 2 + iVar4;
          }
          iVar18 = iVar4 + 1;
          if (iVar4 + 1 < iVar15) {
            iVar18 = iVar15;
          }
          __dest = (uint *)MemAlloc((long)iVar18 << 2);
          puVar17 = (pIVar9->MenusIdSubmittedThisFrame).Data;
          if (puVar17 != (uint *)0x0) {
            memcpy(__dest,puVar17,(long)(pIVar9->MenusIdSubmittedThisFrame).Size << 2);
            MemFree((pIVar9->MenusIdSubmittedThisFrame).Data);
          }
          (pIVar9->MenusIdSubmittedThisFrame).Data = __dest;
          (pIVar9->MenusIdSubmittedThisFrame).Capacity = iVar18;
          lVar13 = (long)(pIVar9->MenusIdSubmittedThisFrame).Size;
        }
        __dest[lVar13] = id;
        (pIVar9->MenusIdSubmittedThisFrame).Size = (pIVar9->MenusIdSubmittedThisFrame).Size + 1;
        local_c8 = CalcTextSize(label,(char *)0x0,true,-1.0);
        bVar10 = IsRootOfOpenMenuSet();
        if (bVar10) {
          PushItemFlag(0x100,true);
        }
        fVar23 = (this->DC).CursorPos.x;
        fVar2 = (this->DC).CursorPos.y;
        PushID(label);
        if (!enabled) {
          BeginDisabled(true);
        }
        uVar21 = (uint)local_101;
        if ((this->DC).LayoutType == 0) {
          fVar22 = (pIVar9->Style).ItemSpacing.x;
          fVar25 = (pIVar9->Style).FramePadding.y;
          local_d8.y = ImGuiWindow::MenuBarHeight(this);
          local_d8.y = local_d8.y + (fVar2 - fVar25);
          (this->DC).CursorPos.x =
               (float)(int)((pIVar9->Style).ItemSpacing.x * 0.5) + (this->DC).CursorPos.x;
          fVar2 = (pIVar9->Style).ItemSpacing.x;
          local_a8.y = (pIVar9->Style).ItemSpacing.y;
          local_a8.x = fVar2 + fVar2;
          local_d8.x = (fVar23 + -1.0) - (float)(int)(fVar22 * 0.5);
          PushStyleVar(0xe,&local_a8);
          IVar24 = (this->DC).CursorPos;
          IVar3.y = (this->DC).CurrLineTextBaseOffset + IVar24.y;
          IVar3.x = (float)(this->DC).MenuColumns.OffsetLabel + IVar24.x;
          local_a8 = (ImVec2)((ulong)local_c8 & 0xffffffff);
          bVar12 = Selectable("",local_101,0x10500001,&local_a8);
          RenderText(IVar3,label,(char *)0x0,true);
          PopStyleVar(1);
          (this->DC).CursorPos.x =
               (float)(int)((pIVar9->Style).ItemSpacing.x * -0.5) + (this->DC).CursorPos.x;
        }
        else {
          local_d8.y = fVar2 - (pIVar9->Style).WindowPadding.y;
          local_58 = ZEXT416(0);
          local_d8.x = fVar23;
          local_d0 = uVar21;
          if ((icon != (char *)0x0) && (*icon != '\0')) {
            local_58._0_8_ = CalcTextSize(icon,(char *)0x0,false,-1.0);
            local_58._8_8_ = extraout_XMM0_Qb;
          }
          fVar22 = ImGuiMenuColumns::DeclColumns
                             (&(this->DC).MenuColumns,local_58._0_4_,local_c8.x,0.0,
                              (float)(int)(pIVar9->FontSize * 1.2));
          local_c8.x = fVar22;
          IVar24 = GetContentRegionAvail();
          fVar22 = IVar24.x - local_c8.x;
          local_48 = ZEXT416(~-(uint)(fVar22 <= 0.0) & (uint)fVar22);
          IVar24 = (this->DC).CursorPos;
          local_68.y = (this->DC).CurrLineTextBaseOffset + IVar24.y;
          local_68.x = (float)(this->DC).MenuColumns.OffsetLabel + IVar24.x;
          uStack_60 = 0;
          local_a8 = (ImVec2)((ulong)local_c8 & 0xffffffff);
          bVar11 = Selectable("",SUB41(local_d0,0),0x11500001,&local_a8);
          local_c8.x._0_1_ = bVar11;
          RenderText(local_68,label,(char *)0x0,true);
          if (0.0 < (float)local_58._0_4_) {
            IVar24.x = (float)(this->DC).MenuColumns.OffsetIcon + fVar23;
            IVar24.y = fVar2 + 0.0;
            RenderText(IVar24,icon,(char *)0x0,true);
          }
          local_d8.y = 0.0;
          draw_list = this->DrawList;
          pos.x = pIVar9->FontSize * 0.3 +
                  (float)local_48._0_4_ + (float)(this->DC).MenuColumns.OffsetMark + fVar23;
          pos.y = fVar2 + 0.0;
          local_d8.x = 0.0;
          col = GetColorU32(0,1.0);
          RenderArrow(draw_list,pos,col,1,1.0);
          bVar12 = local_c8.x._0_1_;
        }
        if (enabled) {
          if (pIVar9->HoveredId != id) goto LAB_00222586;
          bVar20 = pIVar9->NavDisableMouseHover ^ 1;
        }
        else {
          EndDisabled();
LAB_00222586:
          bVar20 = 0;
        }
        if (bVar10) {
          PopItemFlag();
        }
        if ((this->DC).LayoutType == 1) {
          iVar4 = (pIVar9->BeginPopupStack).Size;
          if (((iVar4 < (pIVar9->OpenPopupStack).Size) &&
              (pIVar5 = (pIVar9->OpenPopupStack).Data, pIVar5 != (ImGuiPopupData *)0x0)) &&
             (pIVar6 = pIVar5[iVar4].Window, pIVar6 != (ImGuiWindow *)0x0)) {
            bVar10 = false;
            if ((pIVar6->ParentWindow == this) && (pIVar9->HoveredWindow == this)) {
              fVar2 = pIVar9->FontSize;
              fVar23 = (pIVar6->Pos).x;
              fVar22 = (pIVar6->Pos).y;
              bVar10 = fVar23 != (this->Pos).x;
              bVar11 = (this->Pos).x <= fVar23;
              IVar24 = (pIVar9->IO).MousePos;
              IVar3 = (pIVar9->IO).MouseDelta;
              fVar25 = IVar24.x - IVar3.x;
              local_a8.y = IVar24.y - IVar3.y;
              if (!bVar11 || !bVar10) {
                fVar23 = fVar23 + (pIVar6->Size).x;
              }
              fVar27 = ABS(fVar25 - fVar23) * 0.3;
              fVar26 = fVar2 * 2.5;
              if (fVar27 <= fVar2 * 2.5) {
                fVar26 = fVar27;
              }
              uVar21 = -(uint)(fVar27 < fVar2 * 0.5);
              fVar27 = (float)(uVar21 & (uint)(fVar2 * 0.5) | ~uVar21 & (uint)fVar26);
              local_a8.x = *(float *)(&DAT_00257638 + (ulong)(bVar11 && bVar10) * 4) * -0.5 + fVar25
              ;
              fVar26 = *(float *)(&DAT_00257638 + (ulong)(bVar11 && bVar10) * 4) * fVar2;
              local_38.x = fVar26 + fVar23;
              fVar25 = (fVar22 - fVar27) - local_a8.y;
              uVar21 = -(uint)(fVar2 * -8.0 <= fVar25);
              local_b0.y = (float)(~uVar21 & (uint)(fVar2 * -8.0) | (uint)fVar25 & uVar21) +
                           local_a8.y;
              local_b0.x = fVar26 + fVar23;
              local_38.y = ((pIVar6->Size).y + fVar22 + fVar27) - local_a8.y;
              if (fVar2 * 8.0 <= local_38.y) {
                local_38.y = fVar2 * 8.0;
              }
              local_38.y = local_38.y + local_a8.y;
              bVar10 = ImTriangleContainsPoint(&local_a8,&local_b0,&local_38,&(pIVar9->IO).MousePos)
              ;
            }
          }
          else {
            bVar10 = false;
          }
          if ((!local_101 || (bVar20 & 1) != 0) ||
             (pIVar9->HoveredWindow != this || bVar10 != false)) {
            bVar16 = 0;
          }
          else {
            bVar16 = pIVar9->NavDisableMouseHover ^ 1;
          }
          bVar14 = !local_101 & bVar12;
          bVar19 = bVar10 ^ 1;
          if ((bVar20 & 1) == 0) {
            bVar19 = bVar14;
          }
          if (bVar12 != 0) {
            bVar19 = bVar14;
          }
          if (local_101) {
            bVar19 = bVar14;
          }
          if ((pIVar9->NavId == id) && (bVar12 = bVar16, pIVar9->NavMoveDir == 1)) {
LAB_00222804:
            bVar16 = bVar12;
            NavMoveRequestCancel();
            bVar19 = 1;
          }
        }
        else if (bVar12 == 0) {
          if ((byte)(local_101 | bVar10 & bVar20 ^ 1) == 1) {
            if (pIVar9->NavId == id) {
              bVar16 = 0;
              bVar12 = 0;
              if (pIVar9->NavMoveDir == 3) goto LAB_00222804;
              bVar19 = 0;
              goto LAB_0022281e;
            }
            bVar19 = 0;
          }
          else {
            bVar19 = 1;
          }
          bVar16 = 0;
        }
        else {
          bVar16 = bVar10 & bVar12 & local_101;
          bVar19 = bVar16 ^ 1;
          local_101 = (bool)(local_101 ^ bVar16);
        }
LAB_0022281e:
        if (((!enabled) || (bVar16 != 0)) && (bVar10 = IsPopupOpen(id,0), bVar10)) {
          ClosePopupToLevel((pIVar9->BeginPopupStack).Size,true);
        }
        PopID();
        if (bVar19 == 0) {
          if (local_101 == false) goto LAB_0022287c;
        }
        else {
          if ((local_101 == false) &&
             ((pIVar9->BeginPopupStack).Size < (pIVar9->OpenPopupStack).Size)) {
            OpenPopup(label,0);
            goto LAB_0022287c;
          }
          OpenPopup(label,0);
        }
        local_a8.x = (float)(pIVar9->LastItemData).ID;
        local_a8.y = (float)(pIVar9->LastItemData).InFlags;
        uStack_a0._0_4_ = (pIVar9->LastItemData).StatusFlags;
        uStack_a0._4_4_ = (pIVar9->LastItemData).Rect.Min.x;
        local_98 = *(undefined8 *)&(pIVar9->LastItemData).Rect.Min.y;
        uStack_90 = *(undefined8 *)&(pIVar9->LastItemData).Rect.Max.y;
        uStack_88 = *(undefined8 *)&(pIVar9->LastItemData).NavRect.Min.y;
        uVar7 = *(undefined8 *)&(pIVar9->LastItemData).NavRect.Max.y;
        IStack_74 = (pIVar9->LastItemData).DisplayRect.Max;
        fStack_78 = (pIVar9->LastItemData).DisplayRect.Min.y;
        uStack_80 = (undefined4)uVar7;
        local_7c = (float)((ulong)uVar7 >> 0x20);
        local_b0.x = 0.0;
        local_b0.y = 0.0;
        SetNextWindowPos(&local_d8,1,&local_b0);
        PushStyleVar(7,(pIVar9->Style).PopupRounding);
        bVar10 = BeginPopupEx(id,local_cc);
        PopStyleVar(1);
        if (!bVar10) {
          return bVar10;
        }
        IVar8.y = fStack_78;
        IVar8.x = local_7c;
        (pIVar9->LastItemData).DisplayRect.Min = IVar8;
        (pIVar9->LastItemData).DisplayRect.Max = IStack_74;
        *(undefined8 *)&(pIVar9->LastItemData).NavRect.Min.y = uStack_88;
        *(ulong *)&(pIVar9->LastItemData).NavRect.Max.y = CONCAT44(local_7c,uStack_80);
        *(undefined8 *)&(pIVar9->LastItemData).Rect.Min.y = local_98;
        *(undefined8 *)&(pIVar9->LastItemData).Rect.Max.y = uStack_90;
        (pIVar9->LastItemData).ID = (ImGuiID)local_a8.x;
        (pIVar9->LastItemData).InFlags = (ImGuiItemFlags)local_a8.y;
        (pIVar9->LastItemData).StatusFlags = (undefined4)uStack_a0;
        (pIVar9->LastItemData).Rect.Min.x = (float)uStack_a0._4_4_;
        if (pIVar9->HoveredWindow != this) {
          return bVar10;
        }
        pIVar1 = &(pIVar9->LastItemData).StatusFlags;
        *(byte *)pIVar1 = (byte)*pIVar1 | 0x80;
        return bVar10;
      }
      uVar21 = *puVar17;
      puVar17 = puVar17 + 1;
    } while (uVar21 != id);
    if (local_101) {
      bVar10 = BeginPopupEx(id,local_cc);
      return bVar10;
    }
LAB_0022287c:
    (pIVar9->NextWindowData).Flags = 0;
  }
  return false;
}

Assistant:

bool ImGui::BeginMenuEx(const char* label, const char* icon, bool enabled)
{
    ImGuiWindow* window = GetCurrentWindow();
    if (window->SkipItems)
        return false;

    ImGuiContext& g = *GImGui;
    const ImGuiStyle& style = g.Style;
    const ImGuiID id = window->GetID(label);
    bool menu_is_open = IsPopupOpen(id, ImGuiPopupFlags_None);

    // Sub-menus are ChildWindow so that mouse can be hovering across them (otherwise top-most popup menu would steal focus and not allow hovering on parent menu)
    // The first menu in a hierarchy isn't so hovering doesn't get across (otherwise e.g. resizing borders with ImGuiButtonFlags_FlattenChildren would react), but top-most BeginMenu() will bypass that limitation.
    ImGuiWindowFlags window_flags = ImGuiWindowFlags_ChildMenu | ImGuiWindowFlags_AlwaysAutoResize | ImGuiWindowFlags_NoMove | ImGuiWindowFlags_NoTitleBar | ImGuiWindowFlags_NoSavedSettings | ImGuiWindowFlags_NoNavFocus;
    if (window->Flags & ImGuiWindowFlags_ChildMenu)
        window_flags |= ImGuiWindowFlags_ChildWindow;

    // If a menu with same the ID was already submitted, we will append to it, matching the behavior of Begin().
    // We are relying on a O(N) search - so O(N log N) over the frame - which seems like the most efficient for the expected small amount of BeginMenu() calls per frame.
    // If somehow this is ever becoming a problem we can switch to use e.g. ImGuiStorage mapping key to last frame used.
    if (g.MenusIdSubmittedThisFrame.contains(id))
    {
        if (menu_is_open)
            menu_is_open = BeginPopupEx(id, window_flags); // menu_is_open can be 'false' when the popup is completely clipped (e.g. zero size display)
        else
            g.NextWindowData.ClearFlags();          // we behave like Begin() and need to consume those values
        return menu_is_open;
    }

    // Tag menu as used. Next time BeginMenu() with same ID is called it will append to existing menu
    g.MenusIdSubmittedThisFrame.push_back(id);

    ImVec2 label_size = CalcTextSize(label, NULL, true);

    // Odd hack to allow hovering across menus of a same menu-set (otherwise we wouldn't be able to hover parent without always being a Child window)
    // This is only done for items for the menu set and not the full parent window.
    const bool menuset_is_open = IsRootOfOpenMenuSet();
    if (menuset_is_open)
        PushItemFlag(ImGuiItemFlags_NoWindowHoverableCheck, true);

    // The reference position stored in popup_pos will be used by Begin() to find a suitable position for the child menu,
    // However the final position is going to be different! It is chosen by FindBestWindowPosForPopup().
    // e.g. Menus tend to overlap each other horizontally to amplify relative Z-ordering.
    ImVec2 popup_pos, pos = window->DC.CursorPos;
    PushID(label);
    if (!enabled)
        BeginDisabled();
    const ImGuiMenuColumns* offsets = &window->DC.MenuColumns;
    bool pressed;

    // We use ImGuiSelectableFlags_NoSetKeyOwner to allow down on one menu item, move, up on another.
    const ImGuiSelectableFlags selectable_flags = ImGuiSelectableFlags_NoHoldingActiveID | ImGuiSelectableFlags_NoSetKeyOwner | ImGuiSelectableFlags_SelectOnClick | ImGuiSelectableFlags_DontClosePopups;
    if (window->DC.LayoutType == ImGuiLayoutType_Horizontal)
    {
        // Menu inside an horizontal menu bar
        // Selectable extend their highlight by half ItemSpacing in each direction.
        // For ChildMenu, the popup position will be overwritten by the call to FindBestWindowPosForPopup() in Begin()
        popup_pos = ImVec2(pos.x - 1.0f - IM_FLOOR(style.ItemSpacing.x * 0.5f), pos.y - style.FramePadding.y + window->MenuBarHeight());
        window->DC.CursorPos.x += IM_FLOOR(style.ItemSpacing.x * 0.5f);
        PushStyleVar(ImGuiStyleVar_ItemSpacing, ImVec2(style.ItemSpacing.x * 2.0f, style.ItemSpacing.y));
        float w = label_size.x;
        ImVec2 text_pos(window->DC.CursorPos.x + offsets->OffsetLabel, window->DC.CursorPos.y + window->DC.CurrLineTextBaseOffset);
        pressed = Selectable("", menu_is_open, selectable_flags, ImVec2(w, 0.0f));
        RenderText(text_pos, label);
        PopStyleVar();
        window->DC.CursorPos.x += IM_FLOOR(style.ItemSpacing.x * (-1.0f + 0.5f)); // -1 spacing to compensate the spacing added when Selectable() did a SameLine(). It would also work to call SameLine() ourselves after the PopStyleVar().
    }
    else
    {
        // Menu inside a regular/vertical menu
        // (In a typical menu window where all items are BeginMenu() or MenuItem() calls, extra_w will always be 0.0f.
        //  Only when they are other items sticking out we're going to add spacing, yet only register minimum width into the layout system.
        popup_pos = ImVec2(pos.x, pos.y - style.WindowPadding.y);
        float icon_w = (icon && icon[0]) ? CalcTextSize(icon, NULL).x : 0.0f;
        float checkmark_w = IM_FLOOR(g.FontSize * 1.20f);
        float min_w = window->DC.MenuColumns.DeclColumns(icon_w, label_size.x, 0.0f, checkmark_w); // Feedback to next frame
        float extra_w = ImMax(0.0f, GetContentRegionAvail().x - min_w);
        ImVec2 text_pos(window->DC.CursorPos.x + offsets->OffsetLabel, window->DC.CursorPos.y + window->DC.CurrLineTextBaseOffset);
        pressed = Selectable("", menu_is_open, selectable_flags | ImGuiSelectableFlags_SpanAvailWidth, ImVec2(min_w, 0.0f));
        RenderText(text_pos, label);
        if (icon_w > 0.0f)
            RenderText(pos + ImVec2(offsets->OffsetIcon, 0.0f), icon);
        RenderArrow(window->DrawList, pos + ImVec2(offsets->OffsetMark + extra_w + g.FontSize * 0.30f, 0.0f), GetColorU32(ImGuiCol_Text), ImGuiDir_Right);
    }
    if (!enabled)
        EndDisabled();

    const bool hovered = (g.HoveredId == id) && enabled && !g.NavDisableMouseHover;
    if (menuset_is_open)
        PopItemFlag();

    bool want_open = false;
    bool want_close = false;
    if (window->DC.LayoutType == ImGuiLayoutType_Vertical) // (window->Flags & (ImGuiWindowFlags_Popup|ImGuiWindowFlags_ChildMenu))
    {
        // Close menu when not hovering it anymore unless we are moving roughly in the direction of the menu
        // Implement http://bjk5.com/post/44698559168/breaking-down-amazons-mega-dropdown to avoid using timers, so menus feels more reactive.
        bool moving_toward_child_menu = false;
        ImGuiPopupData* child_popup = (g.BeginPopupStack.Size < g.OpenPopupStack.Size) ? &g.OpenPopupStack[g.BeginPopupStack.Size] : NULL; // Popup candidate (testing below)
        ImGuiWindow* child_menu_window = (child_popup && child_popup->Window && child_popup->Window->ParentWindow == window) ? child_popup->Window : NULL;
        if (g.HoveredWindow == window && child_menu_window != NULL)
        {
            float ref_unit = g.FontSize; // FIXME-DPI
            float child_dir = (window->Pos.x < child_menu_window->Pos.x) ? 1.0f : -1.0f;
            ImRect next_window_rect = child_menu_window->Rect();
            ImVec2 ta = (g.IO.MousePos - g.IO.MouseDelta);
            ImVec2 tb = (child_dir > 0.0f) ? next_window_rect.GetTL() : next_window_rect.GetTR();
            ImVec2 tc = (child_dir > 0.0f) ? next_window_rect.GetBL() : next_window_rect.GetBR();
            float extra = ImClamp(ImFabs(ta.x - tb.x) * 0.30f, ref_unit * 0.5f, ref_unit * 2.5f);   // add a bit of extra slack.
            ta.x += child_dir * -0.5f;
            tb.x += child_dir * ref_unit;
            tc.x += child_dir * ref_unit;
            tb.y = ta.y + ImMax((tb.y - extra) - ta.y, -ref_unit * 8.0f);                           // triangle has maximum height to limit the slope and the bias toward large sub-menus
            tc.y = ta.y + ImMin((tc.y + extra) - ta.y, +ref_unit * 8.0f);
            moving_toward_child_menu = ImTriangleContainsPoint(ta, tb, tc, g.IO.MousePos);
            //GetForegroundDrawList()->AddTriangleFilled(ta, tb, tc, moving_toward_child_menu ? IM_COL32(0,128,0,128) : IM_COL32(128,0,0,128)); // [DEBUG]
        }

        // The 'HovereWindow == window' check creates an inconsistency (e.g. moving away from menu slowly tends to hit same window, whereas moving away fast does not)
        // But we also need to not close the top-menu menu when moving over void. Perhaps we should extend the triangle check to a larger polygon.
        // (Remember to test this on BeginPopup("A")->BeginMenu("B") sequence which behaves slightly differently as B isn't a Child of A and hovering isn't shared.)
        if (menu_is_open && !hovered && g.HoveredWindow == window && !moving_toward_child_menu && !g.NavDisableMouseHover)
            want_close = true;

        // Open
        if (!menu_is_open && pressed) // Click/activate to open
            want_open = true;
        else if (!menu_is_open && hovered && !moving_toward_child_menu) // Hover to open
            want_open = true;
        if (g.NavId == id && g.NavMoveDir == ImGuiDir_Right) // Nav-Right to open
        {
            want_open = true;
            NavMoveRequestCancel();
        }
    }
    else
    {
        // Menu bar
        if (menu_is_open && pressed && menuset_is_open) // Click an open menu again to close it
        {
            want_close = true;
            want_open = menu_is_open = false;
        }
        else if (pressed || (hovered && menuset_is_open && !menu_is_open)) // First click to open, then hover to open others
        {
            want_open = true;
        }
        else if (g.NavId == id && g.NavMoveDir == ImGuiDir_Down) // Nav-Down to open
        {
            want_open = true;
            NavMoveRequestCancel();
        }
    }

    if (!enabled) // explicitly close if an open menu becomes disabled, facilitate users code a lot in pattern such as 'if (BeginMenu("options", has_object)) { ..use object.. }'
        want_close = true;
    if (want_close && IsPopupOpen(id, ImGuiPopupFlags_None))
        ClosePopupToLevel(g.BeginPopupStack.Size, true);

    IMGUI_TEST_ENGINE_ITEM_INFO(id, label, g.LastItemData.StatusFlags | ImGuiItemStatusFlags_Openable | (menu_is_open ? ImGuiItemStatusFlags_Opened : 0));
    PopID();

    if (want_open && !menu_is_open && g.OpenPopupStack.Size > g.BeginPopupStack.Size)
    {
        // Don't reopen/recycle same menu level in the same frame, first close the other menu and yield for a frame.
        OpenPopup(label);
    }
    else if (want_open)
    {
        menu_is_open = true;
        OpenPopup(label);
    }

    if (menu_is_open)
    {
        ImGuiLastItemData last_item_in_parent = g.LastItemData;
        SetNextWindowPos(popup_pos, ImGuiCond_Always);                  // Note: misleading: the value will serve as reference for FindBestWindowPosForPopup(), not actual pos.
        PushStyleVar(ImGuiStyleVar_ChildRounding, style.PopupRounding); // First level will use _PopupRounding, subsequent will use _ChildRounding
        menu_is_open = BeginPopupEx(id, window_flags);                  // menu_is_open can be 'false' when the popup is completely clipped (e.g. zero size display)
        PopStyleVar();
        if (menu_is_open)
        {
            // Restore LastItemData so IsItemXXXX functions can work after BeginMenu()/EndMenu()
            // (This fixes using IsItemClicked() and IsItemHovered(), but IsItemHovered() also relies on its support for ImGuiItemFlags_NoWindowHoverableCheck)
            g.LastItemData = last_item_in_parent;
            if (g.HoveredWindow == window)
                g.LastItemData.StatusFlags |= ImGuiItemStatusFlags_HoveredWindow;
        }
    }
    else
    {
        g.NextWindowData.ClearFlags(); // We behave like Begin() and need to consume those values
    }

    return menu_is_open;
}